

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

llama_sampler *
llama_sampler_init_grammar_impl
          (llama_vocab *vocab,char *grammar_str,char *grammar_root,bool lazy,char **trigger_words,
          size_t num_trigger_words,llama_token *trigger_tokens,size_t num_trigger_tokens,
          char **trigger_patterns,size_t num_trigger_patterns)

{
  string *this;
  long *plVar1;
  long *plVar2;
  undefined1 *puVar3;
  char *pcVar4;
  string *psVar5;
  int iVar6;
  undefined8 *puVar7;
  size_t sVar8;
  llama_sampler *plVar9;
  size_t sVar10;
  char *trigger_pattern_c;
  undefined8 local_d8;
  char local_d0;
  undefined7 uStack_cf;
  char *local_c0;
  string *local_b8;
  undefined8 *local_b0;
  size_t local_a8;
  string trigger_pattern;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  llama_grammar *local_58;
  llama_vocab *local_50;
  long *local_48;
  long *local_40;
  char *local_38;
  
  local_a8 = num_trigger_words;
  puVar7 = (undefined8 *)operator_new(0x50);
  this = (string *)(puVar7 + 1);
  plVar1 = puVar7 + 3;
  puVar7[1] = plVar1;
  puVar7[2] = 0;
  *(undefined1 *)(puVar7 + 3) = 0;
  local_b8 = (string *)(puVar7 + 5);
  plVar2 = puVar7 + 7;
  puVar7[5] = plVar2;
  puVar7[6] = 0;
  *(undefined1 *)(puVar7 + 7) = 0;
  local_b0 = puVar7;
  if ((grammar_str == (char *)0x0) || (*grammar_str == '\0')) {
    puVar3 = (undefined1 *)((long)&trigger_pattern.field_2 + 8);
    trigger_pattern.field_2._M_allocated_capacity = 0;
    trigger_pattern.field_2._M_local_buf[8] = '\0';
    local_70 = 0;
    local_68 = 0;
    local_58 = (llama_grammar *)0x0;
    *puVar7 = vocab;
    trigger_pattern._M_dataplus._M_p = (pointer)vocab;
    trigger_pattern._M_string_length = (size_type)puVar3;
    local_78 = &local_68;
    std::__cxx11::string::operator=(this,(string *)&trigger_pattern._M_string_length);
    std::__cxx11::string::operator=(local_b8,(string *)&local_78);
    puVar7[9] = local_58;
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
    if ((undefined1 *)trigger_pattern._M_string_length != puVar3) {
      operator_delete((void *)trigger_pattern._M_string_length,
                      CONCAT71(trigger_pattern.field_2._9_7_,trigger_pattern.field_2._M_local_buf[8]
                              ) + 1);
    }
  }
  else {
    local_c0 = grammar_str;
    local_48 = plVar2;
    local_40 = plVar1;
    local_38 = grammar_root;
    if (local_a8 != 0 && trigger_words != (char **)0x0) {
      if ((trigger_patterns != (char **)0x0) || (num_trigger_patterns != 0)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
                   ,0x5fc,"GGML_ASSERT(%s) failed",
                   "trigger_patterns == nullptr && num_trigger_patterns == 0");
      }
      trigger_pattern._M_dataplus._M_p = (pointer)&trigger_pattern.field_2;
      local_50 = vocab;
      std::__cxx11::string::_M_construct<char_const*>((string *)&trigger_pattern,"[\\s\\S]*?(","");
      sVar10 = 0;
      trigger_patterns = &trigger_pattern_c;
      do {
        if ((llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
             ::special_chars_abi_cxx11_ == '\0') &&
           (iVar6 = __cxa_guard_acquire(&llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                                         ::special_chars_abi_cxx11_), iVar6 != 0)) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    (&llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                      ::special_chars_abi_cxx11_,"[.^$|()*+?\\[\\]{}\\\\]",0x10);
          __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                       ~basic_regex,
                       &llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                        ::special_chars_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                               ::special_chars_abi_cxx11_);
        }
        if (sVar10 != 0) {
          std::__cxx11::string::append((char *)&trigger_pattern);
        }
        pcVar4 = trigger_words[sVar10];
        local_d8 = 0;
        local_d0 = '\0';
        trigger_pattern_c = &local_d0;
        sVar8 = strlen(pcVar4);
        std::
        __regex_replace<std::back_insert_iterator<std::__cxx11::string>,char_const*,std::__cxx11::regex_traits<char>,char>
                  ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )trigger_patterns,pcVar4,pcVar4 + sVar8,
                   &llama_sampler_init_grammar_impl(llama_vocab_const*,char_const*,char_const*,bool,char_const**,unsigned_long,int_const*,unsigned_long,char_const**,unsigned_long)
                    ::special_chars_abi_cxx11_,"\\$0",3,0);
        std::__cxx11::string::_M_append((char *)&trigger_pattern,(ulong)trigger_pattern_c);
        if (trigger_pattern_c != &local_d0) {
          operator_delete(trigger_pattern_c,CONCAT71(uStack_cf,local_d0) + 1);
        }
        sVar10 = sVar10 + 1;
      } while (local_a8 != sVar10);
      std::__cxx11::string::append((char *)&trigger_pattern);
      vocab = local_50;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)trigger_pattern._M_dataplus._M_p != &trigger_pattern.field_2) {
        operator_delete(trigger_pattern._M_dataplus._M_p,
                        trigger_pattern.field_2._M_allocated_capacity + 1);
      }
      num_trigger_patterns = 1;
    }
    pcVar4 = local_c0;
    trigger_pattern._M_string_length = (long)&trigger_pattern.field_2 + 8;
    trigger_pattern._M_dataplus._M_p = (pointer)vocab;
    sVar8 = strlen(local_c0);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&trigger_pattern._M_string_length,pcVar4,pcVar4 + sVar8);
    pcVar4 = local_38;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,local_38,(allocator<char> *)&trigger_pattern_c);
    local_58 = llama_grammar_init_impl
                         (vocab,local_c0,pcVar4,lazy,trigger_patterns,num_trigger_patterns,
                          trigger_tokens,num_trigger_tokens);
    puVar7 = local_b0;
    *local_b0 = trigger_pattern._M_dataplus._M_p;
    std::__cxx11::string::operator=(this,(string *)&trigger_pattern._M_string_length);
    psVar5 = local_b8;
    std::__cxx11::string::operator=(local_b8,(string *)&local_78);
    puVar7[9] = local_58;
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
    if ((undefined1 *)trigger_pattern._M_string_length !=
        (undefined1 *)((long)&trigger_pattern.field_2 + 8)) {
      operator_delete((void *)trigger_pattern._M_string_length,
                      CONCAT71(trigger_pattern.field_2._9_7_,trigger_pattern.field_2._M_local_buf[8]
                              ) + 1);
    }
    if (puVar7[9] == 0) {
      if (*(long **)psVar5 != local_48) {
        operator_delete(*(long **)psVar5,*local_48 + 1);
      }
      if (*(long **)this != local_40) {
        operator_delete(*(long **)this,*local_40 + 1);
      }
      operator_delete(puVar7,0x50);
      return (llama_sampler *)0x0;
    }
  }
  plVar9 = (llama_sampler *)operator_new(0x10);
  plVar9->iface = &llama_sampler_grammar_i;
  plVar9->ctx = puVar7;
  return plVar9;
}

Assistant:

static struct llama_sampler * llama_sampler_init_grammar_impl(
        const struct llama_vocab * vocab,
                      const char * grammar_str,
                      const char * grammar_root,
                              bool lazy,
                     const char ** trigger_words,
                            size_t num_trigger_words,
               const llama_token * trigger_tokens,
                            size_t num_trigger_tokens,
                     const char ** trigger_patterns,
                            size_t num_trigger_patterns) {
    auto * ctx = new llama_sampler_grammar;

    if (grammar_str != nullptr && grammar_str[0] != '\0') {
        // TODO: remove trigger_words support.
        if (trigger_words != nullptr && num_trigger_words > 0) {
            GGML_ASSERT(trigger_patterns == nullptr && num_trigger_patterns == 0);
            std::string trigger_pattern("[\\s\\S]*?(");
            for (size_t i = 0; i < num_trigger_words; ++i) {
                static const std::regex special_chars("[.^$|()*+?\\[\\]{}\\\\]");
                if (i > 0) {
                    trigger_pattern += "|";
                }
                trigger_pattern += std::regex_replace(trigger_words[i], special_chars, "\\$0");
            }
            trigger_pattern += ")[\\s\\S]*";
            auto trigger_pattern_c = trigger_pattern.c_str();
            trigger_patterns = &trigger_pattern_c;
            num_trigger_patterns = 1;
        }
        *ctx = {
            /* .vocab        = */ vocab,
            /* .grammar_str  = */ grammar_str,
            /* .grammar_root = */ grammar_root,
            /* .grammar      = */ llama_grammar_init_impl(vocab, grammar_str, grammar_root, lazy, trigger_patterns, num_trigger_patterns, trigger_tokens, num_trigger_tokens),
        };
        if (!ctx->grammar) {
            delete ctx;
            return nullptr;
        }
    } else {
        *ctx = {
            /* .vocab        = */ vocab,
            /* .grammar_str  = */ {},
            /* .grammar_root = */ {},
            /* .grammar      = */ nullptr,
        };
    }

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_grammar_i,
        /* .ctx   = */ ctx
    );
}